

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
::try_emplace_impl<Key<4ul>const&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
          *this,Key<4UL> *k)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t i;
  ctrl_t *pcVar3;
  size_t hashval;
  bool bVar4;
  
  auVar2 = ZEXT416(k->_data) * ZEXT816(0xde5fb9d2630458e9);
  hashval = auVar2._8_8_ + auVar2._0_8_;
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
      ::_find_key<Key<4ul>>
                ((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
                  *)this,k,hashval);
  bVar4 = i == 0xffffffffffffffff;
  if (bVar4) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
        ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                          *)this,hashval);
    lVar1 = *(long *)(this + 8);
    *(Data *)(lVar1 + i * 8) = k->_data;
    *(undefined4 *)(lVar1 + 4 + i * 8) = 0;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                *)this,i,(byte)hashval & 0x7f);
    pcVar3 = (ctrl_t *)(i + *(long *)this);
  }
  else {
    pcVar3 = (ctrl_t *)(*(long *)this + i);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = pcVar3;
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 8 + lVar1);
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        size_t hashval = this->hash(k);
        size_t offset = this->_find_key(k, hashval);
        if (offset == (size_t)-1) {
            offset = this->prepare_insert(hashval);
            this->emplace_at(offset, std::piecewise_construct,
                             std::forward_as_tuple(std::forward<K>(k)),
                             std::forward_as_tuple(std::forward<Args>(args)...));
            this->set_ctrl(offset, H2(hashval));
            return {this->iterator_at(offset), true};
        }
        return {this->iterator_at(offset), false};
    }